

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_filesystem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  __mode_t __mask;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  string out_dir;
  string out_file;
  string nested;
  path path1;
  path path2;
  CSV_writer csv;
  undefined1 local_2f0 [25];
  undefined8 uStack_2d7;
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  string local_250;
  resolver local_230;
  path local_218;
  path local_1f0;
  undefined1 local_1c8 [32];
  long local_1a8 [47];
  
  filesystem::path::path(&local_218,"/dir 1/dir 2/");
  filesystem::path::path(&local_1f0,"dir 3");
  filesystem::path::exists(&local_218);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = filesystem::operator<<((ostream *)&std::cout,&local_218);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  filesystem::path::operator/((path *)local_1c8,&local_218,&local_1f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  filesystem::path::operator/((path *)local_2f0,&local_218,&local_1f0);
  filesystem::path::parent_path((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  filesystem::path::operator/((path *)local_2c8,&local_218,&local_1f0);
  filesystem::path::parent_path((path *)local_2f0,(path *)local_2c8);
  filesystem::path::parent_path((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 8));
  filesystem::path::operator/((path *)local_2a0,&local_218,&local_1f0);
  filesystem::path::parent_path((path *)local_2c8,(path *)local_2a0);
  filesystem::path::parent_path((path *)local_2f0,(path *)local_2c8);
  filesystem::path::parent_path((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2a0 + 8));
  filesystem::path::operator/((path *)local_278,&local_218,&local_1f0);
  filesystem::path::parent_path((path *)local_2a0,(path *)local_278);
  filesystem::path::parent_path((path *)local_2c8,(path *)local_2a0);
  filesystem::path::parent_path((path *)local_2f0,(path *)local_2c8);
  filesystem::path::parent_path((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2a0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_278 + 8));
  local_2f0._0_4_ = 1;
  local_2f0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2f0[0x10] = '\0';
  local_2f0._17_7_ = 0;
  local_2f0[0x18] = '\0';
  uStack_2d7 = 0;
  filesystem::path::parent_path((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Current directory = ",0x14);
  filesystem::path::path((path *)local_2f0,".");
  filesystem::path::make_absolute((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  plVar5 = (long *)chrono::GetChronoOutputPath_abi_cxx11_();
  local_2a0._0_8_ = local_2a0 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_2a0,*plVar5,plVar5[1] + *plVar5);
  std::__cxx11::string::append(local_2a0);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,local_2a0._0_8_,
             (char *)(local_2a0._0_8_ + (long)(_Alloc_hider *)local_2a0._8_8_));
  std::__cxx11::string::append(local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Create output directory;  out_dir = ",0x24);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2a0._0_8_,local_2a0._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  out_dir exists? ",0x12);
  filesystem::path::path((path *)local_1c8,(string *)local_2a0);
  filesystem::path::exists((path *)local_1c8);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  filesystem::path::path((path *)local_1c8,(string *)local_2a0);
  bVar2 = filesystem::path::is_directory((path *)local_1c8);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + 8));
  }
  else {
    __mask = umask(0);
    filesystem::path::str_abi_cxx11_((string *)local_2f0,(path *)local_1c8,native_path);
    iVar3 = mkdir((char *)local_2f0._0_8_,0x1ff);
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
    }
    umask(__mask);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + 8));
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...Error creating output directory",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      iVar3 = 1;
      std::ostream::flush();
      goto LAB_00105671;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  ...Created output directory",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  out_dir exists? ",0x12);
  filesystem::path::path((path *)local_1c8,(string *)local_2a0);
  filesystem::path::exists((path *)local_1c8);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  out_dir is directory? ",0x18);
  filesystem::path::path((path *)local_1c8,(string *)local_2a0);
  filesystem::path::is_directory((path *)local_1c8);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  path of out_dir: ",0x13);
  filesystem::path::path((path *)local_1c8,(string *)local_2a0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  abs. path of out_dir: ",0x18);
  filesystem::path::path((path *)local_2f0,(string *)local_2a0);
  filesystem::path::make_absolute((path *)local_1c8,(path *)local_2f0);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Create output file;  out_file = ",0x20);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_278._0_8_,local_278._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  out_file exists? ",0x13);
  filesystem::path::path((path *)local_1c8,(string *)local_278);
  filesystem::path::exists((path *)local_1c8);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1c8 + 8));
  pcVar1 = local_2f0 + 0x10;
  local_2f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,",","");
  chrono::utils::CSV_writer::CSV_writer((CSV_writer *)local_1c8,(string *)local_2f0);
  if ((char *)local_2f0._0_8_ != pcVar1) {
    operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
  }
  poVar4 = std::ostream::_M_insert<double>(1.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  poVar4 = std::ostream::_M_insert<double>(2.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  poVar4 = std::ostream::_M_insert<double>(3.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  poVar4 = std::ostream::_M_insert<double>(1.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1c8._0_8_,local_1c8._8_8_)
  ;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  local_2f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"");
  chrono::utils::CSV_writer::write_to_file
            ((CSV_writer *)local_1c8,(string *)local_278,(string *)local_2f0);
  if ((char *)local_2f0._0_8_ != pcVar1) {
    operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  ...Created output file",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  out_file exists? ",0x13);
  filesystem::path::path((path *)local_2f0,(string *)local_278);
  filesystem::path::exists((path *)local_2f0);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  out_file is file? ",0x14);
  filesystem::path::path((path *)local_2f0,(string *)local_278);
  filesystem::path::is_file((path *)local_2f0);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  path of out_file: ",0x14);
  filesystem::path::path((path *)local_2f0,(string *)local_278);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  file location:    ",0x14);
  filesystem::path::path((path *)local_2c8,(string *)local_278);
  filesystem::path::parent_path((path *)local_2f0,(path *)local_2c8);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  abs. path of out_file: ",0x19);
  filesystem::path::path((path *)local_2c8,(string *)local_278);
  filesystem::path::make_absolute((path *)local_2f0,(path *)local_2c8);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c8 + 8));
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,local_2a0._0_8_,
             (char *)(local_2a0._0_8_ + (long)(_Alloc_hider *)local_2a0._8_8_));
  std::__cxx11::string::append((char *)&local_250);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Create nested directories;  nested = ",0x25);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  nested (as path)   = ",0x17);
  filesystem::path::path((path *)local_2f0,&local_250);
  poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  length of nested   = ",0x17);
  filesystem::path::path((path *)local_2f0,&local_250);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  nested exists? ",0x11)
  ;
  filesystem::path::path((path *)local_2f0,&local_250);
  filesystem::path::exists((path *)local_2f0);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  filesystem::path::path((path *)local_2f0,&local_250);
  bVar2 = filesystem::create_subdirectory((path *)local_2f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2f0 + 8));
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  ...Created nested subdirectories",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  nested exists? ",0x11);
    filesystem::path::path((path *)local_2f0,&local_250);
    filesystem::path::exists((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  nested is directory? ",0x17);
    filesystem::path::path((path *)local_2f0,&local_250);
    filesystem::path::is_directory((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  path of nested: ",0x12);
    filesystem::path::path((path *)local_2f0,&local_250);
    poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  abs. path of nested: ",0x17);
    filesystem::path::path((path *)local_2c8,&local_250);
    filesystem::path::make_absolute((path *)local_2f0,(path *)local_2c8);
    poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"some/path.ext:operator==() = ",0x1d);
    filesystem::path::path((path *)local_2f0,"some/path.ext");
    filesystem::path::path((path *)local_2c8,"some/path.ext");
    if (local_2c8._16_8_ - local_2c8._8_8_ ==
        CONCAT71(local_2f0._17_7_,local_2f0[0x10]) - local_2f0._8_8_) {
      std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c8._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c8._16_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._8_8_);
    }
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"some/path.ext:operator==() (unequal) = ",0x27);
    filesystem::path::path((path *)local_2f0,"some/path.ext");
    filesystem::path::path((path *)local_2c8,"another/path.ext");
    if (local_2c8._16_8_ - local_2c8._8_8_ ==
        CONCAT71(local_2f0._17_7_,local_2f0[0x10]) - local_2f0._8_8_) {
      std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c8._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c8._16_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._8_8_);
    }
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"nonexistant:exists = ",0x15);
    filesystem::path::path((path *)local_2f0,"nonexistant");
    filesystem::path::exists((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"nonexistant:is_file = ",0x16);
    filesystem::path::path((path *)local_2f0,"nonexistant");
    filesystem::path::is_file((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"nonexistant:is_directory = ",0x1b);
    filesystem::path::path((path *)local_2f0,"nonexistant");
    filesystem::path::is_directory((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"nonexistant:filename = ",0x17);
    filesystem::path::path((path *)local_2f0,"nonexistant");
    filesystem::path::filename_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = local_2c8 + 0x10;
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"nonexistant:extension = ",0x18);
    filesystem::path::path((path *)local_2f0,"nonexistant");
    filesystem::path::extension_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:exists = ",0x12);
    filesystem::path::path((path *)local_2f0,(string *)local_278);
    filesystem::path::exists((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:is_file = ",0x13);
    filesystem::path::path((path *)local_2f0,(string *)local_278);
    filesystem::path::is_file((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:is_directory = ",0x18);
    filesystem::path::path((path *)local_2f0,(string *)local_278);
    filesystem::path::is_directory((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:filename = ",0x14);
    filesystem::path::path((path *)local_2f0,(string *)local_278);
    filesystem::path::filename_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:stem = ",0x10);
    filesystem::path::path((path *)local_2f0,(string *)local_278);
    filesystem::path::stem_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:extension = ",0x15);
    filesystem::path::path((path *)local_2f0,(string *)local_278);
    filesystem::path::extension_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_file:make_absolute = ",0x19);
    filesystem::path::path((path *)local_2c8,(string *)local_278);
    filesystem::path::make_absolute((path *)local_2f0,(path *)local_2c8);
    poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_dir:exists = ",0x11);
    filesystem::path::path((path *)local_2f0,(string *)local_2a0);
    filesystem::path::exists((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_dir:is_file = ",0x12);
    filesystem::path::path((path *)local_2f0,(string *)local_2a0);
    filesystem::path::is_file((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_dir:is_directory = ",0x17);
    filesystem::path::path((path *)local_2f0,(string *)local_2a0);
    filesystem::path::is_directory((path *)local_2f0);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_dir:filename = ",0x13);
    filesystem::path::path((path *)local_2f0,(string *)local_2a0);
    filesystem::path::filename_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"out_dir:stem = ",0xf);
    filesystem::path::path((path *)local_2f0,(string *)local_2a0);
    filesystem::path::stem_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_dir:extension = ",0x14);
    filesystem::path::path((path *)local_2f0,(string *)local_2a0);
    filesystem::path::extension_abi_cxx11_((string *)local_2c8,(path *)local_2f0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((char *)local_2c8._0_8_ != pcVar1) {
      operator_delete((void *)local_2c8._0_8_,(ulong)(local_2c8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"out_dir:make_absolute = ",0x18);
    filesystem::path::path((path *)local_2c8,(string *)local_2a0);
    filesystem::path::make_absolute((path *)local_2f0,(path *)local_2c8);
    poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"resolve(out_file) = ",0x14);
    filesystem::resolver::resolver(&local_230);
    filesystem::path::path((path *)local_2c8,(string *)local_278);
    filesystem::resolver::resolve((path *)local_2f0,&local_230,(path *)local_2c8);
    poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_230.m_paths);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"resolve(nonexistant) = ",0x17);
    filesystem::resolver::resolver(&local_230);
    filesystem::path::path((path *)local_2c8,"nonexistant");
    filesystem::resolver::resolve((path *)local_2f0,&local_230,(path *)local_2c8);
    poVar4 = filesystem::operator<<((ostream *)&std::cout,(path *)local_2f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2f0 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c8 + 8));
    std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_230.m_paths);
    iVar3 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  ...Error creating subdirectories",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    iVar3 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  chrono::utils::CSV_writer::~CSV_writer((CSV_writer *)local_1c8);
LAB_00105671:
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
  }
  if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
    operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0.m_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218.m_path);
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
#if defined(WIN32)
    path path1("C:\\dir 1\\dir 2\\");
#else
    path path1("/dir 1/dir 2/");
#endif

    path path2("dir 3");

    cout << path1.exists() << endl;
    cout << path1 << endl;
    cout << (path1 / path2) << endl;
    cout << (path1 / path2).parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path().parent_path() << endl;
    cout << (path1 / path2).parent_path().parent_path().parent_path().parent_path() << endl;
    cout << path().parent_path() << endl;
    cout << endl;

    // Absolute path of current directory
    cout << "Current directory = " << path(".").make_absolute() << endl;
    cout << endl;

    // Create output directory and output file
    std::string out_dir = GetChronoOutputPath() + "DEMO_FILESYSTEM";
    std::string out_file = out_dir + "/foo.txt";

    cout << "Create output directory;  out_dir = " << out_dir << endl;
    cout << "  out_dir exists? " << path(out_dir).exists() << endl;
    if (create_directory(path(out_dir))) {
        cout << "  ...Created output directory" << endl;
    } else {
        cout << "  ...Error creating output directory" << endl;
        return 1;
    }
    cout << "  out_dir exists? " << path(out_dir).exists() << endl;
    cout << "  out_dir is directory? " << path(out_dir).is_directory() << endl;
    cout << "  path of out_dir: " << path(out_dir) << endl;
    cout << "  abs. path of out_dir: " << path(out_dir).make_absolute() << endl;
    cout << endl;

    cout << "Create output file;  out_file = " << out_file << endl;
    cout << "  out_file exists? " << path(out_file).exists() << endl;
    utils::CSV_writer csv(",");
    csv << ChVector<>(1, 2, 3) << ChQuaternion<>(1, 0, 0, 0) << endl;
    csv.write_to_file(out_file);
    cout << "  ...Created output file" << endl;
    cout << "  out_file exists? " << path(out_file).exists() << endl;
    cout << "  out_file is file? " << path(out_file).is_file() << endl;
    cout << "  path of out_file: " << path(out_file) << endl;
    cout << "  file location:    " << path(out_file).parent_path() << endl;
    cout << "  abs. path of out_file: " << path(out_file).make_absolute() << endl;
    cout << endl;

    // Create hierarchy of nested directories
#if defined(WIN32)
    std::string nested = out_dir + "\\child\\grandchild";
#else
    std::string nested = out_dir + "/child/grandchild";
#endif
    cout << "Create nested directories;  nested = " << nested << endl;
    cout << "  nested (as path)   = " << path(nested) << endl;
    cout << "  length of nested   = " << path(nested).length() << endl;
    cout << "  nested exists? " << path(nested).exists() << endl;
    if (create_subdirectory(path(nested))) {
        cout << "  ...Created nested subdirectories" << endl;
    } else {
        cout << "  ...Error creating subdirectories" << endl;
        return 1;
    }
    cout << "  nested exists? " << path(nested).exists() << endl;
    cout << "  nested is directory? " << path(nested).is_directory() << endl;
    cout << "  path of nested: " << path(nested) << endl;
    cout << "  abs. path of nested: " << path(nested).make_absolute() << endl;
    cout << endl;

    // Other tests

    cout << "some/path.ext:operator==() = " << (path("some/path.ext") == path("some/path.ext")) << endl;
    cout << "some/path.ext:operator==() (unequal) = " << (path("some/path.ext") == path("another/path.ext")) << endl;

    cout << "nonexistant:exists = " << path("nonexistant").exists() << endl;
    cout << "nonexistant:is_file = " << path("nonexistant").is_file() << endl;
    cout << "nonexistant:is_directory = " << path("nonexistant").is_directory() << endl;
    cout << "nonexistant:filename = " << path("nonexistant").filename() << endl;
    cout << "nonexistant:extension = " << path("nonexistant").extension() << endl;
    cout << endl;

    cout << "out_file:exists = " << path(out_file).exists() << endl;
    cout << "out_file:is_file = " << path(out_file).is_file() << endl;
    cout << "out_file:is_directory = " << path(out_file).is_directory() << endl;
    cout << "out_file:filename = " << path(out_file).filename() << endl;
    cout << "out_file:stem = " << path(out_file).stem() << endl;
    cout << "out_file:extension = " << path(out_file).extension() << endl;
    cout << "out_file:make_absolute = " << path(out_file).make_absolute() << endl;
    cout << endl;

    cout << "out_dir:exists = " << path(out_dir).exists() << endl;
    cout << "out_dir:is_file = " << path(out_dir).is_file() << endl;
    cout << "out_dir:is_directory = " << path(out_dir).is_directory() << endl;
    cout << "out_dir:filename = " << path(out_dir).filename() << endl;
    cout << "out_dir:stem = " << path(out_dir).stem() << endl;
    cout << "out_dir:extension = " << path(out_dir).extension() << endl;
    cout << "out_dir:make_absolute = " << path(out_dir).make_absolute() << endl;
    cout << endl;

    cout << "resolve(out_file) = " << resolver().resolve(out_file) << endl;
    cout << "resolve(nonexistant) = " << resolver().resolve("nonexistant") << endl;
    return 0;
}